

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvmbcs.cpp
# Opt level: O1

void ucnv_DBCSFromUTF8(UConverterFromUnicodeArgs *pFromUArgs,UConverterToUnicodeArgs *pToUArgs,
                      UErrorCode *pErrorCode)

{
  uint8_t *puVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  UConverterSharedData *pUVar5;
  uint16_t *puVar6;
  bool bVar7;
  UErrorCode *pUVar8;
  UChar32 UVar9;
  long lVar10;
  long lVar11;
  uint8_t uVar12;
  uint uVar13;
  uint uVar14;
  char cVar15;
  char cVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  uint uVar22;
  uint32_t uVar23;
  byte bVar24;
  int iVar25;
  byte *pbVar26;
  byte *pbVar27;
  byte *pbVar28;
  uint local_88;
  uint8_t *target;
  uint32_t local_74;
  UConverter *local_70;
  UConverter *local_68;
  UConverterToUnicodeArgs *local_60;
  UErrorCode *local_58;
  UConverterFromUnicodeArgs *local_50;
  long local_48;
  ushort *local_40;
  UChar *noSource;
  
  local_70 = pToUArgs->converter;
  pbVar26 = (byte *)pToUArgs->source;
  local_68 = pFromUArgs->converter;
  target = (uint8_t *)pFromUArgs->target;
  pbVar28 = (byte *)pToUArgs->sourceLimit;
  uVar17 = (ulong)(byte)local_70->toULength;
  if (local_70->toULength < '\x01') {
    uVar20 = 0;
    uVar13 = 0;
    uVar17 = 0;
  }
  else {
    uVar20 = (ulong)(byte)local_70->mode;
    uVar13 = local_70->toUnicodeStatus;
  }
  pUVar5 = local_68->sharedData;
  iVar25 = ((int)uVar17 - (int)(char)uVar20) + ((int)pbVar28 - (int)pbVar26);
  if ((0 < iVar25) && (bVar2 = pbVar28[-1], (char)bVar2 < '\0')) {
    if ((iVar25 == 1) || (-0x41 < (char)bVar2)) {
      if ((byte)(bVar2 + 0x3e) < 0x2e) {
        pbVar28 = pbVar28 + -1;
      }
    }
    else if (((pbVar28[-2] & 0xf0) == 0xe0) &&
            (((byte)" 000000000000\x1000"[pbVar28[-2] & 0xf] >> (bVar2 >> 5) & 1) != 0)) {
      pbVar28 = pbVar28 + -2;
    }
  }
  uVar14 = *(int *)&pFromUArgs->targetLimit - (int)target;
  puVar6 = (pUVar5->mbcs).fromUnicodeTable;
  local_40 = (pUVar5->mbcs).mbcsIndex;
  local_48 = *(long *)((pUVar5->mbcs).sbcsIndex +
                      (((ulong)(byte)local_68->options & 0xffffffffffffff10) >> 4) * 4 + 0x40);
  uVar23 = (pUVar5->mbcs).asciiRoundtrips;
  bVar2 = (pUVar5->mbcs).unicodeMask;
  local_88 = 0;
  pbVar27 = pbVar26;
  local_74 = uVar23;
  local_60 = pToUArgs;
  local_58 = pErrorCode;
  if (uVar13 == 0) goto LAB_0034ae22;
  if ((int)uVar14 < 1) goto LAB_0034ae22;
  local_70->toUnicodeStatus = 0;
  local_70->toULength = '\0';
  uVar18 = uVar17;
LAB_0034ab97:
  cVar16 = (char)uVar17;
  cVar15 = (char)uVar20;
  local_88._0_1_ = (char)uVar18;
  if (cVar16 < cVar15) {
    uVar18 = uVar17;
    pbVar27 = pbVar26;
    do {
      bVar24 = (byte)uVar18;
      if (local_60->sourceLimit <= pbVar27) {
        uVar20 = (ulong)(char)local_88;
        if ((char)local_88 < (char)bVar24) {
          do {
            local_70->toUBytes[uVar20] = pbVar26[uVar20 - uVar17];
            uVar20 = uVar20 + 1;
          } while (uVar20 < uVar18);
          pbVar26 = pbVar26 + (uVar20 - uVar17);
        }
        else {
          pbVar26 = pbVar27 + (uVar20 - uVar18);
        }
        local_70->toUnicodeStatus = uVar13;
        local_70->toULength = bVar24;
        local_70->mode = (int)cVar15;
        local_60->source = (char *)pbVar26;
        pFromUArgs->target = (char *)target;
        return;
      }
      bVar3 = *pbVar27;
      if ((cVar15 < '\x03') || (1 < bVar24)) {
        bVar24 = (char)bVar3 < -0x40;
      }
      else if (cVar15 == '\x03') {
        bVar24 = '\x01' << (bVar3 >> 5) & " 000000000000\x1000"[uVar13 & 0xf];
      }
      else {
        bVar24 = (byte)(1 << ((byte)uVar13 & 7)) & ""[bVar3 >> 4];
      }
      uVar19 = uVar18;
      if (bVar24 == 0) break;
      pbVar27 = pbVar27 + 1;
      uVar13 = uVar13 * 0x40 + (uint)bVar3;
      uVar18 = uVar18 + 1;
      uVar19 = uVar20;
    } while ((char)uVar18 < cVar15);
    cVar16 = (char)uVar19;
    pbVar26 = pbVar27;
  }
  lVar10 = (long)cVar16;
  if (cVar16 == cVar15) {
    uVar13 = uVar13 - utf8_offsets[lVar10];
    if ((cVar16 < '\x04') || (uVar22 = 0, (bVar2 & 1) != 0)) {
      uVar22 = *(uint *)(puVar6 + (ulong)((uVar13 >> 4 & 0x3f) + (uint)puVar6[(int)uVar13 >> 10]) *
                                  2);
    }
    uVar4 = *(ushort *)(local_48 + (ulong)((uVar22 & 0xffff) << 4 | uVar13 & 0xf) * 2);
    local_88 = (uint)uVar4;
    uVar23 = local_74;
    local_50 = pFromUArgs;
    if (((uVar22 >> (sbyte)(uVar13 & 0xf)) >> 0x10 & 1) == 0) {
      local_88 = (uint)uVar4;
      if (local_68->useFallback != '\0') goto LAB_0034acda;
      if (uVar13 - 0xe000 < 0x1900) goto LAB_0034acda;
      if (0x1ffff < uVar13 - 0xf0000) goto LAB_0034ace3;
      goto LAB_0034acda;
    }
LAB_0034adcc:
    uVar12 = (uint8_t)local_88;
    if (local_88 < 0x100) {
      *target = uVar12;
      iVar25 = -1;
      target = target + 1;
LAB_0034ae20:
      uVar14 = uVar14 + iVar25;
      pbVar27 = pbVar26;
LAB_0034ae22:
      pbVar26 = pbVar27;
      if (pbVar27 < pbVar28) {
        lVar10 = 0;
        do {
          if ((int)uVar14 < 1) {
            pbVar26 = pbVar27 + lVar10;
            goto LAB_0034aa59;
          }
          bVar24 = pbVar27[lVar10];
          uVar13 = (uint)bVar24;
          if ((char)bVar24 < '\0') {
            pbVar26 = pbVar27 + lVar10 + 1;
            bVar7 = true;
            if (bVar24 < 0xe0) {
              if ((0xc1 < bVar24) && (uVar22 = *pbVar26 ^ 0x80, (byte)uVar22 < 0x40)) {
                pbVar26 = pbVar27 + lVar10 + 2;
                uVar4 = *(ushort *)(local_48 + (ulong)(local_40[uVar13 & 0x1f] + uVar22) * 2);
                local_88 = (uint)uVar4;
                if (uVar4 == 0) {
                  uVar13 = (uVar13 & 0x1f) << 6 | uVar22;
                  goto LAB_0034ace3;
                }
LAB_0034ab60:
                bVar7 = false;
              }
            }
            else if (bVar24 < 0xee) {
              if ((((byte)" 000000000000\x1000"[uVar13 & 0xf] >> (*pbVar26 >> 5) & 1) != 0) &&
                 (uVar22 = pbVar27[lVar10 + 2] ^ 0x80, (byte)uVar22 < 0x40)) {
                uVar21 = *pbVar26 & 0x3f | (uVar13 & 0xf) << 6;
                pbVar26 = pbVar27 + lVar10 + 3;
                uVar4 = *(ushort *)(local_48 + (ulong)(local_40[uVar21] + uVar22) * 2);
                local_88 = (uint)uVar4;
                if (uVar4 != 0) {
                  local_88 = (uint)uVar4;
                  goto LAB_0034ab60;
                }
                uVar13 = uVar21 << 6 | uVar22;
                goto LAB_0034ace3;
              }
            }
            uVar23 = local_74;
            if (!bVar7) goto LAB_0034adcc;
            uVar18 = 0;
            uVar20 = (ulong)(byte)(((0xdf < bVar24) - (bVar24 < 0xf0)) + 3);
            if (0x32 < (byte)(bVar24 + 0x3e)) {
              uVar20 = uVar18;
            }
            uVar17 = 1;
            goto LAB_0034ab97;
          }
          if ((uVar23 >> (bVar24 >> 2 & 0x1f) & 1) == 0) goto LAB_0034aafc;
          puVar1 = target + 1;
          *target = bVar24;
          uVar14 = uVar14 - 1;
          lVar10 = lVar10 + 1;
          target = puVar1;
          if ((long)pbVar28 - (long)pbVar27 == lVar10) {
            pbVar26 = pbVar27 + lVar10;
            break;
          }
        } while( true );
      }
      goto LAB_0034ae34;
    }
    puVar1 = target + 1;
    *target = (uint8_t)(local_88 >> 8);
    if (1 < (int)uVar14) {
      target = target + 2;
      *puVar1 = uVar12;
      iVar25 = -2;
      goto LAB_0034ae20;
    }
    local_68->charErrorBuffer[0] = uVar12;
    local_68->charErrorBufferLength = '\x01';
    target = puVar1;
LAB_0034aa59:
    *local_58 = U_BUFFER_OVERFLOW_ERROR;
LAB_0034ae34:
    pbVar28 = pbVar26;
    if (((*local_58 < U_ILLEGAL_ARGUMENT_ERROR) && (local_68->preFromUFirstCP < 0)) &&
       (pbVar27 = (byte *)local_60->sourceLimit, pbVar26 < pbVar27)) {
      bVar2 = *pbVar26;
      uVar13 = (uint)bVar2;
      local_70->toUBytes[0] = bVar2;
      iVar25 = 1;
      if (((char)bVar2 < '\0') && (iVar25 = 0, (byte)(bVar2 + 0x3e) < 0x33)) {
        iVar25 = ((uint)(0xdf < bVar2) - (uint)(bVar2 < 0xf0)) + 3;
      }
      pbVar28 = pbVar26 + 1;
      lVar10 = 1;
      if (pbVar28 < pbVar27) {
        lVar10 = 1;
        do {
          bVar2 = pbVar26[lVar10];
          local_70->toUBytes[(char)lVar10] = bVar2;
          uVar13 = uVar13 * 0x40 + (uint)bVar2;
          lVar10 = lVar10 + 1;
        } while ((long)pbVar27 - (long)pbVar26 != lVar10);
        pbVar28 = pbVar26 + lVar10;
      }
      local_70->toUnicodeStatus = uVar13;
      local_70->toULength = (int8_t)lVar10;
      local_70->mode = iVar25;
    }
    local_60->source = (char *)pbVar28;
    pFromUArgs->target = (char *)target;
  }
  else {
    lVar11 = (long)(char)local_88;
    if ((char)local_88 < cVar16) {
      pbVar26 = pbVar26 + -lVar10;
      do {
        local_70->toUBytes[lVar11] = pbVar26[lVar11];
        lVar11 = lVar11 + 1;
      } while (lVar11 < lVar10);
    }
    else {
      lVar11 = lVar11 - lVar10;
    }
    local_70->toULength = cVar16;
    local_60->source = (char *)(pbVar26 + lVar11);
    pFromUArgs->target = (char *)target;
    *local_58 = U_ILLEGAL_CHAR_FOUND;
  }
  return;
LAB_0034aafc:
  local_88 = (uint)*(ushort *)(local_48 + (ulong)(*local_40 + uVar13) * 2);
  pbVar26 = pbVar27 + lVar10 + 1;
LAB_0034acda:
  if ((short)local_88 != 0) goto LAB_0034adcc;
LAB_0034ace3:
  pUVar8 = local_58;
  noSource = L"";
  UVar9 = _extFromU(local_68,local_68->sharedData,uVar13,&noSource,L"",&target,target + uVar14,
                    (int32_t **)0x0,-1,pFromUArgs->flush,local_58);
  if (*pUVar8 < U_ILLEGAL_ARGUMENT_ERROR) {
    if (local_68->preFromUFirstCP < 0) {
      uVar14 = *(int *)&pFromUArgs->targetLimit - (int)target;
      bVar7 = false;
      goto LAB_0034ad66;
    }
    *local_58 = U_USING_DEFAULT_WARNING;
  }
  else {
    local_68->fromUChar32 = UVar9;
  }
  bVar7 = true;
LAB_0034ad66:
  pbVar27 = pbVar26;
  uVar23 = local_74;
  if (bVar7) goto LAB_0034ae34;
  goto LAB_0034ae22;
}

Assistant:

static void U_CALLCONV
ucnv_DBCSFromUTF8(UConverterFromUnicodeArgs *pFromUArgs,
                  UConverterToUnicodeArgs *pToUArgs,
                  UErrorCode *pErrorCode) {
    UConverter *utf8, *cnv;
    const uint8_t *source, *sourceLimit;
    uint8_t *target;
    int32_t targetCapacity;

    const uint16_t *table, *mbcsIndex;
    const uint16_t *results;

    int8_t oldToULength, toULength, toULimit;

    UChar32 c;
    uint8_t b, t1, t2;

    uint32_t stage2Entry;
    uint32_t asciiRoundtrips;
    uint16_t value = 0;
    UBool hasSupplementary;

    /* set up the local pointers */
    utf8=pToUArgs->converter;
    cnv=pFromUArgs->converter;
    source=(uint8_t *)pToUArgs->source;
    sourceLimit=(uint8_t *)pToUArgs->sourceLimit;
    target=(uint8_t *)pFromUArgs->target;
    targetCapacity=(int32_t)(pFromUArgs->targetLimit-pFromUArgs->target);

    table=cnv->sharedData->mbcs.fromUnicodeTable;
    mbcsIndex=cnv->sharedData->mbcs.mbcsIndex;
    if((cnv->options&UCNV_OPTION_SWAP_LFNL)!=0) {
        results=(uint16_t *)cnv->sharedData->mbcs.swapLFNLFromUnicodeBytes;
    } else {
        results=(uint16_t *)cnv->sharedData->mbcs.fromUnicodeBytes;
    }
    asciiRoundtrips=cnv->sharedData->mbcs.asciiRoundtrips;

    hasSupplementary=(UBool)(cnv->sharedData->mbcs.unicodeMask&UCNV_HAS_SUPPLEMENTARY);

    /* get the converter state from the UTF-8 UConverter */
    if(utf8->toULength > 0) {
        toULength=oldToULength=utf8->toULength;
        toULimit=(int8_t)utf8->mode;
        c=(UChar32)utf8->toUnicodeStatus;
    } else {
        toULength=oldToULength=toULimit=0;
        c = 0;
    }

    // The conversion loop checks source<sourceLimit only once per 1/2/3-byte character.
    // If the buffer ends with a truncated 2- or 3-byte sequence,
    // then we reduce the sourceLimit to before that,
    // and collect the remaining bytes after the conversion loop.
    {
        // Do not go back into the bytes that will be read for finishing a partial
        // sequence from the previous buffer.
        int32_t length=(int32_t)(sourceLimit-source) - (toULimit-oldToULength);
        if(length>0) {
            uint8_t b1=*(sourceLimit-1);
            if(U8_IS_SINGLE(b1)) {
                // common ASCII character
            } else if(U8_IS_TRAIL(b1) && length>=2) {
                uint8_t b2=*(sourceLimit-2);
                if(0xe0<=b2 && b2<0xf0 && U8_IS_VALID_LEAD3_AND_T1(b2, b1)) {
                    // truncated 3-byte sequence
                    sourceLimit-=2;
                }
            } else if(0xc2<=b1 && b1<0xf0) {
                // truncated 2- or 3-byte sequence
                --sourceLimit;
            }
        }
    }

    if(c!=0 && targetCapacity>0) {
        utf8->toUnicodeStatus=0;
        utf8->toULength=0;
        goto moreBytes;
        /* See note in ucnv_SBCSFromUTF8() about this goto. */
    }

    /* conversion loop */
    while(source<sourceLimit) {
        if(targetCapacity>0) {
            b=*source++;
            if(U8_IS_SINGLE(b)) {
                /* convert ASCII */
                if(IS_ASCII_ROUNDTRIP(b, asciiRoundtrips)) {
                    *target++=b;
                    --targetCapacity;
                    continue;
                } else {
                    value=DBCS_RESULT_FROM_UTF8(mbcsIndex, results, 0, b);
                    if(value==0) {
                        c=b;
                        goto unassigned;
                    }
                }
            } else {
                if(b>=0xe0) {
                    if( /* handle U+0800..U+D7FF inline */
                        b<=0xed &&  // do not assume maxFastUChar>0xd7ff
                        U8_IS_VALID_LEAD3_AND_T1(b, t1=source[0]) &&
                        (t2=(uint8_t)(source[1]-0x80)) <= 0x3f
                    ) {
                        c=((b&0xf)<<6)|(t1&0x3f);
                        source+=2;
                        value=DBCS_RESULT_FROM_UTF8(mbcsIndex, results, c, t2);
                        if(value==0) {
                            c=(c<<6)|t2;
                            goto unassigned;
                        }
                    } else {
                        c=-1;
                    }
                } else {
                    if( /* handle U+0080..U+07FF inline */
                        b>=0xc2 &&
                        (t1=(uint8_t)(*source-0x80)) <= 0x3f
                    ) {
                        c=b&0x1f;
                        ++source;
                        value=DBCS_RESULT_FROM_UTF8(mbcsIndex, results, c, t1);
                        if(value==0) {
                            c=(c<<6)|t1;
                            goto unassigned;
                        }
                    } else {
                        c=-1;
                    }
                }

                if(c<0) {
                    /* handle "complicated" and error cases, and continuing partial characters */
                    oldToULength=0;
                    toULength=1;
                    toULimit=U8_COUNT_BYTES_NON_ASCII(b);
                    c=b;
moreBytes:
                    while(toULength<toULimit) {
                        /*
                         * The sourceLimit may have been adjusted before the conversion loop
                         * to stop before a truncated sequence.
                         * Here we need to use the real limit in case we have two truncated
                         * sequences at the end.
                         * See ticket #7492.
                         */
                        if(source<(uint8_t *)pToUArgs->sourceLimit) {
                            b=*source;
                            if(icu::UTF8::isValidTrail(c, b, toULength, toULimit)) {
                                ++source;
                                ++toULength;
                                c=(c<<6)+b;
                            } else {
                                break; /* sequence too short, stop with toULength<toULimit */
                            }
                        } else {
                            /* store the partial UTF-8 character, compatible with the regular UTF-8 converter */
                            source-=(toULength-oldToULength);
                            while(oldToULength<toULength) {
                                utf8->toUBytes[oldToULength++]=*source++;
                            }
                            utf8->toUnicodeStatus=c;
                            utf8->toULength=toULength;
                            utf8->mode=toULimit;
                            pToUArgs->source=(char *)source;
                            pFromUArgs->target=(char *)target;
                            return;
                        }
                    }

                    if(toULength==toULimit) {
                        c-=utf8_offsets[toULength];
                        if(toULength<=3) {  /* BMP */
                            stage2Entry=MBCS_STAGE_2_FROM_U(table, c);
                        } else {
                            /* supplementary code point */
                            if(!hasSupplementary) {
                                /* BMP-only codepages are stored without stage 1 entries for supplementary code points */
                                stage2Entry=0;
                            } else {
                                stage2Entry=MBCS_STAGE_2_FROM_U(table, c);
                            }
                        }
                    } else {
                        /* error handling: illegal UTF-8 byte sequence */
                        source-=(toULength-oldToULength);
                        while(oldToULength<toULength) {
                            utf8->toUBytes[oldToULength++]=*source++;
                        }
                        utf8->toULength=toULength;
                        pToUArgs->source=(char *)source;
                        pFromUArgs->target=(char *)target;
                        *pErrorCode=U_ILLEGAL_CHAR_FOUND;
                        return;
                    }

                    /* get the bytes and the length for the output */
                    /* MBCS_OUTPUT_2 */
                    value=MBCS_VALUE_2_FROM_STAGE_2(results, stage2Entry, c);

                    /* is this code point assigned, or do we use fallbacks? */
                    if(!(MBCS_FROM_U_IS_ROUNDTRIP(stage2Entry, c) ||
                         (UCNV_FROM_U_USE_FALLBACK(cnv, c) && value!=0))
                    ) {
                        goto unassigned;
                    }
                }
            }

            /* write the output character bytes from value and length */
            /* from the first if in the loop we know that targetCapacity>0 */
            if(value<=0xff) {
                /* this is easy because we know that there is enough space */
                *target++=(uint8_t)value;
                --targetCapacity;
            } else /* length==2 */ {
                *target++=(uint8_t)(value>>8);
                if(2<=targetCapacity) {
                    *target++=(uint8_t)value;
                    targetCapacity-=2;
                } else {
                    cnv->charErrorBuffer[0]=(char)value;
                    cnv->charErrorBufferLength=1;

                    /* target overflow */
                    *pErrorCode=U_BUFFER_OVERFLOW_ERROR;
                    break;
                }
            }
            continue;

unassigned:
            {
                /*
                 * Try an extension mapping.
                 * Pass in no source because we don't have UTF-16 input.
                 * If we have a partial match on c, we will return and revert
                 * to UTF-8->UTF-16->charset conversion.
                 */
                static const UChar nul=0;
                const UChar *noSource=&nul;
                c=_extFromU(cnv, cnv->sharedData,
                            c, &noSource, noSource,
                            &target, target+targetCapacity,
                            NULL, -1,
                            pFromUArgs->flush,
                            pErrorCode);

                if(U_FAILURE(*pErrorCode)) {
                    /* not mappable or buffer overflow */
                    cnv->fromUChar32=c;
                    break;
                } else if(cnv->preFromUFirstCP>=0) {
                    /*
                     * Partial match, return and revert to pivoting.
                     * In normal from-UTF-16 conversion, we would just continue
                     * but then exit the loop because the extension match would
                     * have consumed the source.
                     */
                    *pErrorCode=U_USING_DEFAULT_WARNING;
                    break;
                } else {
                    /* a mapping was written to the target, continue */

                    /* recalculate the targetCapacity after an extension mapping */
                    targetCapacity=(int32_t)(pFromUArgs->targetLimit-(char *)target);
                    continue;
                }
            }
        } else {
            /* target is full */
            *pErrorCode=U_BUFFER_OVERFLOW_ERROR;
            break;
        }
    }

    /*
     * The sourceLimit may have been adjusted before the conversion loop
     * to stop before a truncated sequence.
     * If so, then collect the truncated sequence now.
     */
    if(U_SUCCESS(*pErrorCode) &&
            cnv->preFromUFirstCP<0 &&
            source<(sourceLimit=(uint8_t *)pToUArgs->sourceLimit)) {
        c=utf8->toUBytes[0]=b=*source++;
        toULength=1;
        toULimit=U8_COUNT_BYTES(b);
        while(source<sourceLimit) {
            utf8->toUBytes[toULength++]=b=*source++;
            c=(c<<6)+b;
        }
        utf8->toUnicodeStatus=c;
        utf8->toULength=toULength;
        utf8->mode=toULimit;
    }

    /* write back the updated pointers */
    pToUArgs->source=(char *)source;
    pFromUArgs->target=(char *)target;
}